

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

void nn_global_init(void)

{
  nn_transport *pnVar1;
  char *pcVar2;
  bool local_21;
  nn_transport *tp;
  char *envvar;
  int i;
  
  if (self.socks == (nn_sock **)0x0) {
    nn_alloc_init();
    nn_random_seed();
    self.socks = (nn_sock **)nn_alloc_(0x1400);
    if (self.socks == (nn_sock **)0x0) {
      nn_backtrace_print();
      fprintf(_stderr,"Out of memory (%s:%d)\n",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/src/core/global.c"
              ,0xf0);
      fflush(_stderr);
      nn_err_abort();
    }
    for (envvar._4_4_ = 0; envvar._4_4_ != 0x200; envvar._4_4_ = envvar._4_4_ + 1) {
      self.socks[envvar._4_4_] = (nn_sock *)0x0;
    }
    self.nsocks = 0;
    self.flags = 0;
    pcVar2 = getenv("NN_PRINT_ERRORS");
    local_21 = false;
    if (pcVar2 != (char *)0x0) {
      local_21 = *pcVar2 != '\0';
    }
    self.print_errors = (int)local_21;
    self.unused = (uint16_t *)(self.socks + 0x200);
    if ((nn_sock **)self.unused == (nn_sock **)0x0) {
      nn_backtrace_print();
      fprintf(_stderr,"Out of memory (%s:%d)\n",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/src/core/global.c"
              ,0xfd);
      fflush(_stderr);
      nn_err_abort();
    }
    for (envvar._4_4_ = 0; envvar._4_4_ != 0x200; envvar._4_4_ = envvar._4_4_ + 1) {
      self.unused[envvar._4_4_] = 0x1ff - (short)envvar._4_4_;
    }
    for (envvar._4_4_ = 0; pnVar1 = nn_transports[envvar._4_4_], pnVar1 != (nn_transport *)0x0;
        envvar._4_4_ = envvar._4_4_ + 1) {
      if (pnVar1->init != (_func_void *)0x0) {
        (*pnVar1->init)();
      }
    }
    nn_pool_init(&self.pool);
  }
  return;
}

Assistant:

static void nn_global_init (void)
{
    int i;
    char *envvar;

#if defined NN_HAVE_WINDOWS
    int rc;
    WSADATA data;
#endif
    const struct nn_transport *tp;

    /*  Check whether the library was already initialised. If so, do nothing. */
    if (self.socks)
        return;

    /*  On Windows, initialise the socket library. */
#if defined NN_HAVE_WINDOWS
    rc = WSAStartup (MAKEWORD (2, 2), &data);
    nn_assert (rc == 0);
    nn_assert (LOBYTE (data.wVersion) == 2 &&
        HIBYTE (data.wVersion) == 2);
#endif

    /*  Initialise the memory allocation subsystem. */
    nn_alloc_init ();

    /*  Seed the pseudo-random number generator. */
    nn_random_seed ();

    /*  Allocate the global table of SP sockets. */
    self.socks = nn_alloc ((sizeof (struct nn_sock*) * NN_MAX_SOCKETS) +
        (sizeof (uint16_t) * NN_MAX_SOCKETS), "socket table");
    alloc_assert (self.socks);
    for (i = 0; i != NN_MAX_SOCKETS; ++i)
        self.socks [i] = NULL;
    self.nsocks = 0;
    self.flags = 0;

    /*  Print connection and accepting errors to the stderr  */
    envvar = getenv("NN_PRINT_ERRORS");
    /*  any non-empty string is true */
    self.print_errors = envvar && *envvar;

    /*  Allocate the stack of unused file descriptors. */
    self.unused = (uint16_t*) (self.socks + NN_MAX_SOCKETS);
    alloc_assert (self.unused);
    for (i = 0; i != NN_MAX_SOCKETS; ++i)
        self.unused [i] = NN_MAX_SOCKETS - i - 1;

    /*  Initialize transports if needed. */
    for (i = 0; (tp = nn_transports[i]) != NULL; i++) {
        if (tp->init != NULL) {
            tp->init ();
        }
    }

    /*  Start the worker threads. */
    nn_pool_init (&self.pool);
}